

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.h
# Opt level: O2

void __thiscall webpp::Response::Response(Response *this,string *content,HttpStatus status)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  HttpStatus local_44;
  __shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  element_type *local_30;
  
  (this->write_buffer).
  super___shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->write_buffer).
  super___shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->response_stream).
  super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->response_stream).
  super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->status = status;
  local_44 = status;
  std::make_shared<boost::asio::basic_streambuf<std::allocator<char>>>();
  std::__shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&(this->write_buffer).
               super___shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  local_30 = (this->write_buffer).
             super___shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  std::make_shared<std::ostream,boost::asio::basic_streambuf<std::allocator<char>>*>
            (&local_40._M_ptr);
  std::__shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>::
  operator=((__shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             *)this,(__shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  poVar1 = std::operator<<((ostream *)
                           (this->response_stream).
                           super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,"HTTP/1.1 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,status);
  poVar1 = std::operator<<(poVar1," ");
  pmVar2 = std::
           map<webpp::http::HttpStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<webpp::http::HttpStatus>,_std::allocator<std::pair<const_webpp::http::HttpStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<webpp::http::HttpStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<webpp::http::HttpStatus>,_std::allocator<std::pair<const_webpp::http::HttpStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)http::HttpStatusMap_abi_cxx11_,&local_44);
  poVar1 = std::operator<<(poVar1,(string *)pmVar2);
  poVar1 = std::operator<<(poVar1,"\r\nContent-Length: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\r\n\r\n");
  std::operator<<(poVar1,(string *)content);
  return;
}

Assistant:

Response(const std::string&& content,
           const http::HttpStatus status = http::OK)
      : status(status) {
    auto len = content.length();
    write_buffer = std::make_shared<boost::asio::streambuf>();
    response_stream = std::make_shared<std::ostream>(write_buffer.get());

    *response_stream << "HTTP/1.1 " << status << " "
                     << http::HttpStatusMap[status]
                     << "\r\nContent-Length: " << len << "\r\n\r\n"
                     << content;
  }